

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O2

long __thiscall binlog::Range::read<long>(Range *this)

{
  long lVar1;
  
  throw_if_overflow(this,8);
  lVar1 = *(long *)this->_begin;
  this->_begin = (char *)((long)this->_begin + 8);
  return lVar1;
}

Assistant:

T read()
  {
    static_assert(std::is_trivially_copyable<T>::value, "T must be trivially copyable");

    throw_if_overflow(sizeof(T));

    T dst;
    memcpy(&dst, _begin, sizeof(T));
    _begin += sizeof(T);

    return dst;
  }